

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void pageant_passphrase_request_success(PageantClientDialogId *dlgid,ptrlen passphrase)

{
  long lVar1;
  _Bool _Var2;
  PageantKey *pk_00;
  strbuf *buf_o;
  ssh2_userkey *psVar3;
  ptrlen data;
  PageantSignOp *so;
  PageantKeyRequestNode *pkr;
  strbuf *ppsb;
  undefined1 local_58 [8];
  BinarySource src [1];
  char *error;
  PageantKey *pk;
  PageantClientDialogId *dlgid_local;
  ptrlen passphrase_local;
  
  pk_00 = (PageantKey *)(dlgid + -0x14);
  if (!gui_request_in_progress) {
    __assert_fail("gui_request_in_progress",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                  0x217,"void pageant_passphrase_request_success(PageantClientDialogId *, ptrlen)");
  }
  gui_request_in_progress = false;
  *(undefined1 *)&dlgid[-6].dummy = 0;
  if (*(long *)(dlgid + -10) == 0) {
    data = ptrlen_from_strbuf(*(strbuf **)(dlgid + -8));
    BinarySource_INIT__((BinarySource *)local_58,data);
    buf_o = strbuf_dup_nm(passphrase);
    psVar3 = ppk_load_s((BinarySource *)local_58,buf_o->s,(char **)&src[0].binarysource_);
    *(ssh2_userkey **)(dlgid + -10) = psVar3;
    strbuf_free(buf_o);
    if (*(long *)(dlgid + -10) == 0) {
      fail_requests_for_key(pk_00,"unable to decrypt key");
      return;
    }
    if (*(ssh2_userkey **)(dlgid + -10) == &ssh2_wrong_passphrase) {
      *(undefined8 *)(dlgid + -10) = 0;
      if (*(PageantClientDialogId **)(dlgid + -2) == dlgid + -4) {
        return;
      }
      lVar1 = *(long *)(dlgid + -2);
      *(undefined1 *)&dlgid[-6].dummy = 0;
      _Var2 = request_passphrase((PageantClient *)**(undefined8 **)(lVar1 + 0x18),pk_00);
      if (_Var2) {
        return;
      }
      fail_requests_for_key(pk_00,"unable to continue creating passphrase prompts");
      return;
    }
    keylist_update();
  }
  unblock_requests_for_key(pk_00);
  unblock_pending_gui_requests();
  return;
}

Assistant:

void pageant_passphrase_request_success(PageantClientDialogId *dlgid,
                                        ptrlen passphrase)
{
    PageantKey *pk = container_of(dlgid, PageantKey, dlgid);

    assert(gui_request_in_progress);
    gui_request_in_progress = false;
    pk->decryption_prompt_active = false;

    if (!pk->skey) {
        const char *error;

        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(
                                      pk->encrypted_key_file));

        strbuf *ppsb = strbuf_dup_nm(passphrase);
        pk->skey = ppk_load_s(src, ppsb->s, &error);
        strbuf_free(ppsb);

        if (!pk->skey) {
            fail_requests_for_key(pk, "unable to decrypt key");
            return;
        } else if (pk->skey == SSH2_WRONG_PASSPHRASE) {
            pk->skey = NULL;

            /*
             * Find a PageantClient to use for another attempt at
             * request_passphrase.
             */
            PageantKeyRequestNode *pkr = pk->blocked_requests.next;
            if (pkr == &pk->blocked_requests) {
                /*
                 * Special case: if all the requests have gone away at
                 * this point, we need not bother putting up a request
                 * at all any more.
                 */
                return;
            }

            PageantSignOp *so = container_of(pk->blocked_requests.next,
                                             PageantSignOp, pkr);

            pk->decryption_prompt_active = false;
            if (!request_passphrase(so->pao.info->pc, pk)) {
                fail_requests_for_key(pk, "unable to continue creating "
                                      "passphrase prompts");
            }
            return;
        } else {
            keylist_update();
        }
    }

    unblock_requests_for_key(pk);

    unblock_pending_gui_requests();
}